

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pasubub_mips(uint64_t fs,uint64_t ft)

{
  char cVar1;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  unkuint9 Var35;
  undefined1 auVar36 [11];
  undefined1 auVar37 [13];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [11];
  undefined1 auVar41 [14];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  uint6 uVar46;
  uint6 uVar47;
  ushort uVar48;
  uint uVar49;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  undefined1 auVar50 [16];
  short sVar54;
  uint uVar55;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar61 [16];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined4 uVar56;
  undefined6 uVar57;
  undefined8 uVar58;
  undefined1 auVar59 [12];
  undefined1 auVar60 [14];
  undefined1 auVar62 [16];
  
  auVar18._8_6_ = 0;
  auVar18._0_8_ = fs;
  auVar18[0xe] = (char)(fs >> 0x38);
  auVar21._8_4_ = 0;
  auVar21._0_8_ = fs;
  auVar21[0xc] = (char)(fs >> 0x30);
  auVar21._13_2_ = auVar18._13_2_;
  auVar23._8_4_ = 0;
  auVar23._0_8_ = fs;
  auVar23._12_3_ = auVar21._12_3_;
  uVar66 = auVar23._11_4_;
  auVar26._8_2_ = 0;
  auVar26._0_8_ = fs;
  auVar26[10] = (char)(fs >> 0x28);
  auVar26._11_4_ = uVar66;
  auVar28._8_2_ = 0;
  auVar28._0_8_ = fs;
  auVar28._10_5_ = auVar26._10_5_;
  auVar30[8] = (char)(fs >> 0x20);
  auVar30._0_8_ = fs;
  auVar30._9_6_ = auVar28._9_6_;
  auVar34._7_8_ = 0;
  auVar34._0_7_ = auVar30._8_7_;
  Var35 = CONCAT81(SUB158(auVar34 << 0x40,7),(char)(fs >> 0x18));
  auVar42._9_6_ = 0;
  auVar42._0_9_ = Var35;
  auVar36._1_10_ = SUB1510(auVar42 << 0x30,5);
  auVar36[0] = (char)(fs >> 0x10);
  auVar43._11_4_ = 0;
  auVar43._0_11_ = auVar36;
  auVar37._1_12_ = SUB1512(auVar43 << 0x20,3);
  auVar37[0] = (char)(fs >> 8);
  uVar48 = CONCAT11(0,(byte)fs);
  auVar33._2_13_ = auVar37;
  auVar33._0_2_ = uVar48;
  auVar19._10_2_ = 0;
  auVar19._0_10_ = auVar33._0_10_;
  auVar19._12_2_ = (short)Var35;
  uVar46 = CONCAT42(auVar19._10_4_,auVar36._0_2_);
  auVar38._6_8_ = 0;
  auVar38._0_6_ = uVar46;
  auVar16._8_6_ = 0;
  auVar16._0_8_ = ft;
  auVar16[0xe] = (char)(ft >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = ft;
  auVar20[0xc] = (char)(ft >> 0x30);
  auVar20._13_2_ = auVar16._13_2_;
  auVar22._8_4_ = 0;
  auVar22._0_8_ = ft;
  auVar22._12_3_ = auVar20._12_3_;
  uVar53 = auVar22._11_4_;
  auVar24._8_2_ = 0;
  auVar24._0_8_ = ft;
  auVar24[10] = (char)(ft >> 0x28);
  auVar24._11_4_ = uVar53;
  auVar27._8_2_ = 0;
  auVar27._0_8_ = ft;
  auVar27._10_5_ = auVar24._10_5_;
  auVar29[8] = (char)(ft >> 0x20);
  auVar29._0_8_ = ft;
  auVar29._9_6_ = auVar27._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar29._8_7_;
  Var35 = CONCAT81(SUB158(auVar39 << 0x40,7),(char)(ft >> 0x18));
  auVar44._9_6_ = 0;
  auVar44._0_9_ = Var35;
  auVar40._1_10_ = SUB1510(auVar44 << 0x30,5);
  auVar40[0] = (char)(ft >> 0x10);
  auVar45._11_4_ = 0;
  auVar45._0_11_ = auVar40;
  auVar31[2] = (char)(ft >> 8);
  auVar31._0_2_ = (ushort)ft;
  auVar31._3_12_ = SUB1512(auVar45 << 0x20,3);
  auVar32._2_13_ = auVar31._2_13_;
  auVar32._0_2_ = (ushort)ft & 0xff;
  auVar17._10_2_ = 0;
  auVar17._0_10_ = auVar32._0_10_;
  auVar17._12_2_ = (short)Var35;
  uVar47 = CONCAT42(auVar17._10_4_,auVar40._0_2_);
  auVar41._6_8_ = 0;
  auVar41._0_6_ = uVar47;
  auVar25._4_2_ = auVar31._2_2_;
  auVar25._0_4_ = auVar32._0_4_;
  auVar25._6_8_ = SUB148(auVar41 << 0x40,6);
  uVar55 = (uint)uVar48 - (auVar32._0_4_ & 0xffff);
  uVar63 = (int)CONCAT82(SUB148(auVar38 << 0x40,6),auVar37._0_2_) - auVar25._4_4_;
  uVar64 = (int)uVar46 - (int)uVar47;
  uVar65 = (auVar19._10_4_ >> 0x10) - (auVar17._10_4_ >> 0x10);
  uVar49 = (uint)auVar30._8_2_ - (uint)auVar29._8_2_;
  uVar51 = (uint)auVar26._10_2_ - (uint)auVar24._10_2_;
  uVar52 = (uVar66 >> 8 & 0xffff) - (uVar53 >> 8 & 0xffff);
  uVar53 = (uVar66 >> 0x18) - (uVar53 >> 0x18);
  uVar66 = (int)uVar55 >> 0x1f;
  uVar67 = (int)uVar63 >> 0x1f;
  uVar68 = (int)uVar64 >> 0x1f;
  uVar69 = (int)uVar65 >> 0x1f;
  auVar61._0_4_ = (uVar55 ^ uVar66) - uVar66;
  auVar61._4_4_ = (uVar63 ^ uVar67) - uVar67;
  auVar61._8_4_ = (uVar64 ^ uVar68) - uVar68;
  auVar61._12_4_ = (uVar65 ^ uVar69) - uVar69;
  uVar66 = (int)uVar49 >> 0x1f;
  uVar55 = (int)uVar51 >> 0x1f;
  uVar63 = (int)uVar52 >> 0x1f;
  uVar64 = (int)uVar53 >> 0x1f;
  auVar50._0_4_ = (uVar49 ^ uVar66) - uVar66;
  auVar50._4_4_ = (uVar51 ^ uVar55) - uVar55;
  auVar50._8_4_ = (uVar52 ^ uVar63) - uVar63;
  auVar50._12_4_ = (uVar53 ^ uVar64) - uVar64;
  auVar50 = auVar50 & _DAT_00d60a50;
  auVar61 = auVar61 & _DAT_00d60a50;
  sVar9 = auVar61._0_2_;
  cVar1 = (0 < sVar9) * (sVar9 < 0x100) * auVar61[0] - (0xff < sVar9);
  sVar9 = auVar61._2_2_;
  sVar54 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar61[2] - (0xff < sVar9),cVar1);
  sVar9 = auVar61._4_2_;
  cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar61[4] - (0xff < sVar9);
  sVar9 = auVar61._6_2_;
  uVar56 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar61[6] - (0xff < sVar9),
                    CONCAT12(cVar2,sVar54));
  sVar9 = auVar61._8_2_;
  cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar61[8] - (0xff < sVar9);
  sVar9 = auVar61._10_2_;
  uVar57 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar61[10] - (0xff < sVar9),
                    CONCAT14(cVar3,uVar56));
  sVar9 = auVar61._12_2_;
  cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar61[0xc] - (0xff < sVar9);
  sVar9 = auVar61._14_2_;
  uVar58 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar61[0xe] - (0xff < sVar9),
                    CONCAT16(cVar4,uVar57));
  sVar9 = auVar50._0_2_;
  cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar50[0] - (0xff < sVar9);
  sVar9 = auVar50._2_2_;
  auVar59._0_10_ =
       CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar50[2] - (0xff < sVar9),CONCAT18(cVar5,uVar58));
  sVar9 = auVar50._4_2_;
  cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar50[4] - (0xff < sVar9);
  auVar59[10] = cVar6;
  sVar9 = auVar50._6_2_;
  auVar59[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar50[6] - (0xff < sVar9);
  sVar9 = auVar50._8_2_;
  cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar50[8] - (0xff < sVar9);
  auVar60[0xc] = cVar7;
  auVar60._0_12_ = auVar59;
  sVar9 = auVar50._10_2_;
  auVar60[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar50[10] - (0xff < sVar9);
  sVar9 = auVar50._12_2_;
  cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar50[0xc] - (0xff < sVar9);
  auVar62[0xe] = cVar8;
  auVar62._0_14_ = auVar60;
  sVar9 = auVar50._14_2_;
  auVar62[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar50[0xe] - (0xff < sVar9);
  sVar9 = (short)((uint)uVar56 >> 0x10);
  sVar10 = (short)((uint6)uVar57 >> 0x20);
  sVar11 = (short)((ulong)uVar58 >> 0x30);
  sVar12 = (short)((unkuint10)auVar59._0_10_ >> 0x40);
  sVar13 = auVar59._10_2_;
  sVar14 = auVar60._12_2_;
  sVar15 = auVar62._14_2_;
  return CONCAT17((0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15),
                  CONCAT16((0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14),
                           CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13),
                                    CONCAT14((0 < sVar12) * (sVar12 < 0x100) * cVar5 -
                                             (0xff < sVar12),
                                             CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar4 -
                                                      (0xff < sVar11),
                                                      CONCAT12((0 < sVar10) * (sVar10 < 0x100) *
                                                               cVar3 - (0xff < sVar10),
                                                               CONCAT11((0 < sVar9) *
                                                                        (sVar9 < 0x100) * cVar2 -
                                                                        (0xff < sVar9),
                                                                        (0 < sVar54) *
                                                                        (sVar54 < 0x100) * cVar1 -
                                                                        (0xff < sVar54))))))));
}

Assistant:

uint64_t helper_pasubub(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.ub[i] - vt.ub[i];
        vs.ub[i] = (r < 0 ? -r : r);
    }
    return vs.d;
}